

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O3

int unicode_get_cc(uint32_t c)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint32_t code;
  uint local_c;
  
  uVar2 = get_index_pos(&local_c,c,"M\x03",0x1b);
  if (-1 < (int)uVar2) {
    pbVar4 = unicode_cc_table + uVar2;
    do {
      bVar1 = *pbVar4;
      uVar2 = bVar1 & 0x3f;
      if (uVar2 < 0x30) {
        pbVar5 = pbVar4 + 1;
      }
      else if (uVar2 < 0x38) {
        pbVar5 = pbVar4 + 2;
        uVar2 = (uVar2 * 0x100 + (uint)pbVar4[1]) - 0x2fd0;
      }
      else {
        pbVar5 = pbVar4 + 3;
        uVar2 = (uVar2 + 0xffffc8 | (uint)pbVar4[1]) * 0x100 + (uint)pbVar4[2] + 0x830;
      }
      pbVar4 = pbVar5 + (-1 < (char)bVar1);
      local_c = uVar2 + local_c + 1;
    } while (local_c <= c);
    iVar3 = (*(code *)(&DAT_0017d4f4 + *(int *)(&DAT_0017d4f4 + (ulong)(bVar1 >> 6) * 4)))
                      (&DAT_0017d4f4,
                       &DAT_0017d4f4 + *(int *)(&DAT_0017d4f4 + (ulong)(bVar1 >> 6) * 4));
    return iVar3;
  }
  return 0;
}

Assistant:

static int unicode_get_cc(uint32_t c)
{
    uint32_t code, n, type, cc, c1, b;
    int pos;
    const uint8_t *p;
    
    pos = get_index_pos(&code, c,
                        unicode_cc_index, sizeof(unicode_cc_index) / 3);
    if (pos < 0)
        return 0;
    p = unicode_cc_table + pos;
    for(;;) {
        b = *p++;
        type = b >> 6;
        n = b & 0x3f;
        if (n < 48) {
        } else if (n < 56) {
            n = (n - 48) << 8;
            n |= *p++;
            n += 48;
        } else {
            n = (n - 56) << 8;
            n |= *p++ << 8;
            n |= *p++;
            n += 48 + (1 << 11);
        }
        if (type <= 1)
            p++;
        c1 = code + n + 1;
        if (c < c1) {
            switch(type) {
            case 0:
                cc = p[-1];
                break;
            case 1:
                cc = p[-1] + c - code;
                break;
            case 2:
                cc = 0;
                break;
            default:
            case 3:
                cc = 230;
                break;
            }
            return cc;
        }
        code = c1;
    }
}